

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_huffman_code_lengths(uint *lengths,uint *frequencies,size_t numcodes,uint maxbitlen)

{
  BPMNode *pBVar1;
  size_t __size;
  uint uVar2;
  BPMNode *pBVar3;
  BPMNode *pBVar4;
  BPMNode *pBVar5;
  undefined4 uVar6;
  bool bVar7;
  BPMNode *leaves;
  ulong uVar8;
  BPMNode *pBVar9;
  BPMNode **ppBVar10;
  BPMNode **ppBVar11;
  bool bVar12;
  uint uVar13;
  ulong uVar14;
  BPMNode *pBVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  BPMLists lists;
  BPMLists local_88;
  size_t local_50;
  uint *local_48;
  BPMNode *local_40;
  BPMNode *local_38;
  
  if ((ulong)(uint)(1 << (maxbitlen & 0x1f)) <= numcodes - 1) {
    return 0x50;
  }
  leaves = (BPMNode *)malloc(numcodes * 0x18);
  if (leaves == (BPMNode *)0x0) {
    return 0x53;
  }
  if (numcodes == 0) {
    uVar19 = 0;
  }
  else {
    uVar8 = 0;
    uVar19 = 0;
    do {
      if (frequencies[uVar8] != 0) {
        leaves[uVar19].weight = frequencies[uVar8];
        leaves[uVar19].index = (uint)uVar8;
        uVar19 = uVar19 + 1;
      }
      uVar8 = uVar8 + 1;
    } while ((uVar8 & 0xffffffff) != numcodes);
  }
  if (numcodes != 0) {
    uVar8 = 0;
    do {
      lengths[uVar8] = 0;
      uVar8 = uVar8 + 1;
    } while ((uVar8 & 0xffffffff) != numcodes);
  }
  if (uVar19 == 1) {
    uVar13 = leaves->index;
    lengths[uVar13] = 1;
    lengths[(ulong)uVar13 == 0] = 1;
  }
  else {
    if (uVar19 != 0) {
      __size = uVar19 * 0x18;
      local_48 = lengths;
      pBVar9 = (BPMNode *)malloc(__size);
      if (1 < uVar19) {
        uVar8 = 1;
        bVar7 = false;
        do {
          bVar12 = bVar7;
          pBVar15 = leaves;
          pBVar4 = pBVar9;
          if (!bVar12) {
            pBVar15 = pBVar9;
            pBVar4 = leaves;
          }
          uVar21 = uVar8 * 2;
          uVar17 = 0;
          do {
            uVar22 = uVar17 + uVar8;
            if (uVar19 <= uVar17 + uVar8) {
              uVar22 = uVar19;
            }
            uVar16 = uVar17 + uVar21;
            pBVar5 = pBVar15;
            uVar18 = uVar17;
            uVar20 = uVar22;
            uVar23 = uVar19;
            if (uVar16 < uVar19) {
              uVar23 = uVar16;
            }
            for (; uVar17 < uVar23; uVar17 = uVar17 + 1) {
              if ((uVar18 < uVar22) &&
                 ((uVar23 <= uVar20 || (pBVar4[uVar18].weight <= pBVar4[uVar20].weight)))) {
                uVar14 = uVar18 + 1;
              }
              else {
                uVar14 = uVar18;
                uVar18 = uVar20;
                uVar20 = uVar20 + 1;
              }
              uVar6 = *(undefined4 *)&pBVar4[uVar18].field_0x14;
              pBVar5->in_use = pBVar4[uVar18].in_use;
              *(undefined4 *)&pBVar5->field_0x14 = uVar6;
              pBVar1 = pBVar4 + uVar18;
              uVar13 = pBVar1->index;
              pBVar3 = pBVar1->tail;
              pBVar5->weight = pBVar1->weight;
              pBVar5->index = uVar13;
              pBVar5->tail = pBVar3;
              pBVar5 = pBVar5 + 1;
              uVar18 = uVar14;
            }
            pBVar15 = pBVar15 + uVar8 * 2;
            uVar17 = uVar16;
          } while (uVar16 < uVar19);
          uVar8 = uVar21;
          bVar7 = (bool)(bVar12 ^ 1);
        } while (uVar21 < uVar19);
        local_50 = __size;
        local_40 = pBVar9;
        local_38 = leaves;
        if (!bVar12) {
          memcpy(leaves,pBVar9,__size);
        }
      }
      free(pBVar9);
      uVar2 = (maxbitlen + 1) * maxbitlen * 2;
      local_88.nextfree = 0;
      local_88.memsize = uVar2;
      local_88.numfree = uVar2;
      local_88.listsize = maxbitlen;
      pBVar9 = (BPMNode *)malloc((ulong)uVar2 * 0x18);
      local_88.memory = pBVar9;
      ppBVar10 = (BPMNode **)malloc((ulong)uVar2 * 8);
      local_88.freelist = ppBVar10;
      ppBVar11 = (BPMNode **)malloc((ulong)maxbitlen << 3);
      local_88.chains0 = ppBVar11;
      local_88.chains1 = (BPMNode **)malloc((ulong)maxbitlen << 3);
      uVar13 = 0x53;
      if (((ppBVar11 != (BPMNode **)0x0 && ppBVar10 != (BPMNode **)0x0) && pBVar9 != (BPMNode *)0x0)
          && local_88.chains1 != (BPMNode **)0x0) {
        if (uVar2 != 0) {
          uVar8 = 0;
          do {
            local_88.freelist[uVar8] = local_88.memory + uVar8;
            uVar8 = uVar8 + 1;
          } while (uVar8 != uVar2);
        }
        bpmnode_create(&local_88,leaves->weight,1,(BPMNode *)0x0);
        bpmnode_create(&local_88,leaves[1].weight,2,(BPMNode *)0x0);
        if ((ulong)local_88.listsize != 0) {
          uVar8 = 0;
          do {
            local_88.chains0[uVar8] = local_88.memory;
            local_88.chains1[uVar8] = local_88.memory + 1;
            uVar8 = uVar8 + 1;
          } while (local_88.listsize != uVar8);
        }
        uVar8 = uVar19 * 2 - 2;
        if (uVar8 != 2) {
          uVar21 = 2;
          do {
            boundaryPM(&local_88,leaves,uVar19,maxbitlen - 1,(int)uVar21);
            uVar21 = (ulong)((int)uVar21 + 1);
          } while (uVar8 != uVar21);
        }
        for (pBVar9 = local_88.chains1[maxbitlen - 1]; uVar13 = 0, pBVar9 != (BPMNode *)0x0;
            pBVar9 = pBVar9->tail) {
          if (pBVar9->index != 0) {
            uVar19 = 0;
            do {
              local_48[leaves[uVar19].index] = local_48[leaves[uVar19].index] + 1;
              uVar13 = (int)uVar19 + 1;
              uVar19 = (ulong)uVar13;
            } while (uVar13 != pBVar9->index);
          }
        }
      }
      free(local_88.memory);
      free(local_88.freelist);
      free(local_88.chains0);
      free(local_88.chains1);
      goto LAB_0030aae4;
    }
    lengths[0] = 1;
    lengths[1] = 1;
  }
  uVar13 = 0;
LAB_0030aae4:
  free(leaves);
  return uVar13;
}

Assistant:

unsigned lodepng_huffman_code_lengths(unsigned* lengths, const unsigned* frequencies,
                                      size_t numcodes, unsigned maxbitlen)
{
  unsigned error = 0;
  unsigned i;
  size_t numpresent = 0; /*number of symbols with non-zero frequency*/
  BPMNode* leaves; /*the symbols, only those with > 0 frequency*/

  if(numcodes == 0) return 80; /*error: a tree of 0 symbols is not supposed to be made*/
  if((1u << maxbitlen) < numcodes) return 80; /*error: represent all symbols*/

  leaves = (BPMNode*)lodepng_malloc(numcodes * sizeof(*leaves));
  if(!leaves) return 83; /*alloc fail*/

  for(i = 0; i != numcodes; ++i)
  {
    if(frequencies[i] > 0)
    {
      leaves[numpresent].weight = (int)frequencies[i];
      leaves[numpresent].index = i;
      ++numpresent;
    }
  }

  for(i = 0; i != numcodes; ++i) lengths[i] = 0;

  /*ensure at least two present symbols. There should be at least one symbol
  according to RFC 1951 section 3.2.7. Some decoders incorrectly require two. To
  make these work as well ensure there are at least two symbols. The
  Package-Merge code below also doesn't work correctly if there's only one
  symbol, it'd give it the theoritical 0 bits but in practice zlib wants 1 bit*/
  if(numpresent == 0)
  {
    lengths[0] = lengths[1] = 1; /*note that for RFC 1951 section 3.2.7, only lengths[0] = 1 is needed*/
  }
  else if(numpresent == 1)
  {
    lengths[leaves[0].index] = 1;
    lengths[leaves[0].index == 0 ? 1 : 0] = 1;
  }
  else
  {
    BPMLists lists;
    BPMNode* node;

    bpmnode_sort(leaves, numpresent);

    lists.listsize = maxbitlen;
    lists.memsize = 2 * maxbitlen * (maxbitlen + 1);
    lists.nextfree = 0;
    lists.numfree = lists.memsize;
    lists.memory = (BPMNode*)lodepng_malloc(lists.memsize * sizeof(*lists.memory));
    lists.freelist = (BPMNode**)lodepng_malloc(lists.memsize * sizeof(BPMNode*));
    lists.chains0 = (BPMNode**)lodepng_malloc(lists.listsize * sizeof(BPMNode*));
    lists.chains1 = (BPMNode**)lodepng_malloc(lists.listsize * sizeof(BPMNode*));
    if(!lists.memory || !lists.freelist || !lists.chains0 || !lists.chains1) error = 83; /*alloc fail*/

    if(!error)
    {
      for(i = 0; i != lists.memsize; ++i) lists.freelist[i] = &lists.memory[i];

      bpmnode_create(&lists, leaves[0].weight, 1, 0);
      bpmnode_create(&lists, leaves[1].weight, 2, 0);

      for(i = 0; i != lists.listsize; ++i)
      {
        lists.chains0[i] = &lists.memory[0];
        lists.chains1[i] = &lists.memory[1];
      }

      /*each boundaryPM call adds one chain to the last list, and we need 2 * numpresent - 2 chains.*/
      for(i = 2; i != 2 * numpresent - 2; ++i) boundaryPM(&lists, leaves, numpresent, (int)maxbitlen - 1, (int)i);

      for(node = lists.chains1[maxbitlen - 1]; node; node = node->tail)
      {
        for(i = 0; i != node->index; ++i) ++lengths[leaves[i].index];
      }
    }

    lodepng_free(lists.memory);
    lodepng_free(lists.freelist);
    lodepng_free(lists.chains0);
    lodepng_free(lists.chains1);
  }

  lodepng_free(leaves);
  return error;
}